

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addMomentum(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,
                double minValue,double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  SGDOptimizer *this_01;
  DoubleParameter *this_02;
  DoubleRange *this_03;
  
  this = nn->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = this->optimizer_;
  if (this_00 == (Optimizer *)0x0) {
    this_00 = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(this_00);
    this->optimizer_ = this_00;
  }
  if (this_00->_oneof_case_[0] == 10) {
    this_01 = (this_00->OptimizerType_).sgdoptimizer_;
  }
  else {
    CoreML::Specification::Optimizer::clear_OptimizerType(this_00);
    this_00->_oneof_case_[0] = 10;
    this_01 = (SGDOptimizer *)operator_new(0x30);
    CoreML::Specification::SGDOptimizer::SGDOptimizer(this_01);
    (this_00->OptimizerType_).sgdoptimizer_ = this_01;
  }
  this_02 = this_01->momentum_;
  if (this_02 == (DoubleParameter *)0x0) {
    this_02 = (DoubleParameter *)operator_new(0x28);
    CoreML::Specification::DoubleParameter::DoubleParameter(this_02);
    this_01->momentum_ = this_02;
  }
  this_02->defaultvalue_ = defaultValue;
  if (this_02->_oneof_case_[0] == 10) {
    this_03 = (this_02->AllowedValues_).range_;
  }
  else {
    CoreML::Specification::DoubleParameter::clear_AllowedValues(this_02);
    this_02->_oneof_case_[0] = 10;
    this_03 = (DoubleRange *)operator_new(0x28);
    CoreML::Specification::DoubleRange::DoubleRange(this_03);
    (this_02->AllowedValues_).range_ = this_03;
  }
  this_03->minvalue_ = minValue;
  this_03->maxvalue_ = maxValue;
  return;
}

Assistant:

void addMomentum(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::SGDOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            realOptimizer = optimizer->mutable_sgdoptimizer();
            break;
        default:
            break;
    }
    
    auto momentum = realOptimizer->mutable_momentum();
    
    momentum->set_defaultvalue(defaultValue);
    
    auto doubleRange = momentum->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}